

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>>::
emplace<QModelIndex,unsigned_int_const&>
          (QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>> *this,qsizetype i,
          QModelIndex *args,uint *args_1)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  QPersistentModelIndex QVar5;
  pair<QPersistentModelIndex,_unsigned_int> *__dest;
  long in_FS_OFFSET;
  Inserter local_70;
  QPersistentModelIndex local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_004622fb:
    local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex(&local_48,args);
    puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,*args_1);
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(pair<QPersistentModelIndex,_unsigned_int> **)0x0,
               (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0);
    QVar5.d = local_48.d;
    if (i == 0 && lVar3 != 0) {
      lVar3 = *(long *)(this + 8);
      local_48.d = (QPersistentModelIndexData *)0x0;
      *(QPersistentModelIndexData **)(lVar3 + -0x10) = QVar5.d;
      *(undefined4 *)(lVar3 + -8) = puStack_40._0_4_;
      *(long *)(this + 8) = lVar3 + -0x10;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      puVar1 = (undefined8 *)(*(long *)(this + 8) + i * 0x10);
      __dest = (pair<QPersistentModelIndex,_unsigned_int> *)(puVar1 + 2);
      local_70.nInserts = 1;
      local_70.bytes = (*(long *)(this + 0x10) - i) * 0x10;
      local_70.data = (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this;
      local_70.displaceTo = __dest;
      memmove(__dest,(void *)(*(long *)(this + 8) + i * 0x10),local_70.bytes);
      QVar5.d = local_48.d;
      local_48.d = (QPersistentModelIndexData *)0x0;
      *puVar1 = QVar5.d;
      *(undefined4 *)(puVar1 + 1) = puStack_40._0_4_;
      local_70.displaceFrom = __dest;
      QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::Inserter::~Inserter
                (&local_70);
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) + i)) {
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(lVar3 + i * 0x10),args)
      ;
      *(uint *)(lVar3 + 8 + i * 0x10) = *args_1;
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_004622fb;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(uVar4 - 0x10),args);
      *(uint *)(uVar4 - 8) = *args_1;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }